

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_macro_functional_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5cd7e9f::ns::Employee_AMN::Employee_AMN
          (Employee_AMN *this,string *name,string *surname)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->surname_)._M_dataplus._M_p = (pointer)&(this->surname_).field_2;
  pcVar1 = (surname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->surname_,pcVar1,pcVar1 + surname->_M_string_length);
  return;
}

Assistant:

Employee_AMN(const std::string& name, const std::string& surname)
            : name_(name), surname_(surname)
        {
        }